

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

void slang::ast::Lookup::unqualifiedImpl
               (Scope *scope,string_view name,LookupLocation location,
               optional<slang::SourceRange> sourceRange,bitmask<slang::ast::LookupFlags> flags,
               SymbolIndex outOfBlockIndex,LookupResult *result)

{
  SymbolKind SVar1;
  WildcardImportSymbol *this;
  Scope *scope_00;
  ForwardingTypedefSymbol *pFVar2;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  optional<slang::SourceRange> sourceRange_02;
  string_view lookupName;
  string_view arg;
  string_view arg_00;
  string_view name_00;
  bool bVar3;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *this_00;
  iterator iVar4;
  TypeAliasType *pTVar5;
  PackageSymbol *pPVar6;
  pointer pIVar7;
  ExplicitImportSymbol *pEVar8;
  Symbol *pSVar9;
  reference pIVar10;
  Diagnostic *pDVar11;
  SubroutineSymbol *pSVar12;
  ConstraintBlockSymbol *pCVar13;
  ClassType *pCVar14;
  Type *pTVar15;
  GenericClassDefSymbol *pGVar16;
  SubroutineSymbol *pSVar17;
  ForwardingTypedefSymbol **ppFVar18;
  TransparentMemberSymbol *pTVar19;
  MethodPrototypeSymbol *this_01;
  ModportClockingSymbol *pMVar20;
  DeclaredType *pDVar21;
  SymbolIndex SVar22;
  ulong capacity;
  Symbol *__src;
  size_type sVar23;
  Symbol *pSVar24;
  pointer __dest;
  size_t __n;
  SymbolIndex outOfBlockIndex_00;
  Import *pair;
  long lVar25;
  span<const_slang::ast::WildcardImportSymbol_*const,_18446744073709551615UL> sVar26;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>::templated_iterator<const_slang::ast::Symbol_*>,_bool>
  pVar27;
  LookupLocation location_00;
  string_view name_local;
  Symbol *imported;
  int local_128;
  undefined1 local_120 [16];
  SmallVector<Import,_4UL> imports;
  anon_class_32_4_2e62d3a1 reportRecursiveError;
  SmallSet<const_slang::ast::Symbol_*,_2UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
  importDedup;
  
  local_120._0_8_ = location.scope;
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  reportRecursiveError.sourceRange = &sourceRange;
  pSVar24 = (Symbol *)&name_local;
  local_120._8_4_ = location.index;
  reportRecursiveError.result = result;
  reportRecursiveError.scope = scope;
  reportRecursiveError.name = (string_view *)pSVar24;
  this_00 = &Scope::getNameMap(scope)->
             super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  ;
  iVar4 = ska::detailv3::
          sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
          ::find(this_00,(basic_string_view<char,_std::char_traits<char>_> *)pSVar24);
  if (iVar4.current == this_00->entries + this_00->num_slots_minus_one + (long)this_00->max_lookups)
  {
    pSVar12 = (SubroutineSymbol *)0x0;
LAB_002207c2:
    sVar26 = Scope::getWildcardImports(scope);
    if (sVar26.size_ == 0) {
LAB_00220b05:
      pSVar24 = scope->thisSym;
      scope_00 = pSVar24->parentScope;
      if (scope_00 == (Scope *)0x0) {
        return;
      }
      SVar22 = pSVar24->indexInScope + 1;
      SVar1 = pSVar24->kind;
      if (SVar1 == ConstraintBlock) {
        pCVar13 = Symbol::as<slang::ast::ConstraintBlockSymbol>(pSVar24);
        outOfBlockIndex_00 = pCVar13->outOfBlockIndex;
        outOfBlockIndex = SVar22;
      }
      else if (SVar1 == Subroutine) {
        pSVar12 = Symbol::as<slang::ast::SubroutineSymbol>(pSVar24);
        outOfBlockIndex_00 = pSVar12->outOfBlockIndex;
        outOfBlockIndex = SVar22;
      }
      else {
        outOfBlockIndex_00 = 0;
        if ((outOfBlockIndex == 0) && (outOfBlockIndex = SVar22, SVar1 == ClassType)) {
          pCVar14 = Symbol::as<slang::ast::ClassType>(pSVar24);
          pTVar15 = ClassType::getBaseClass(pCVar14);
          outOfBlockIndex_00 = 0;
          if (pTVar15 == (Type *)0x0) {
            bVar3 = false;
          }
          else {
            bVar3 = Type::isError(pTVar15);
          }
          result->suppressUndeclared = (bool)(result->suppressUndeclared | bVar3);
        }
      }
      name_00._M_str = name_local._M_str;
      name_00._M_len = name_local._M_len;
      sourceRange_02.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._17_7_;
      sourceRange_02.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_engaged;
      sourceRange_02.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      sourceRange_02.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      location_00.index = outOfBlockIndex;
      location_00.scope = scope_00;
      location_00._12_4_ = 0;
      unqualifiedImpl(scope_00,name_00,location_00,sourceRange_02,flags,outOfBlockIndex_00,result);
      return;
    }
    imports.super_SmallVectorBase<Import>.data_ =
         (pointer)imports.super_SmallVectorBase<Import>.firstElement;
    imports.super_SmallVectorBase<Import>.len = 0;
    imports.super_SmallVectorBase<Import>.cap = 4;
    SmallSet<const_slang::ast::Symbol_*,_2UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
    ::SmallSet(&importDedup);
    for (lVar25 = 0; sVar26.size_ << 3 != lVar25; lVar25 = lVar25 + 8) {
      this = *(WildcardImportSymbol **)((long)sVar26.data_ + lVar25);
      imported = (Symbol *)(this->super_Symbol).parentScope;
      local_128 = (this->super_Symbol).indexInScope + 1;
      pSVar24 = (Symbol *)&imported;
      bVar3 = LookupLocation::operator<((LookupLocation *)local_120,(LookupLocation *)pSVar24);
      if (bVar3) break;
      pPVar6 = WildcardImportSymbol::getPackage(this);
      if (pPVar6 == (PackageSymbol *)0x0) {
        result->suppressUndeclared = true;
      }
      else {
        lookupName._M_str = name_local._M_str;
        lookupName._M_len = name_local._M_len;
        pSVar24 = (Symbol *)name_local._M_len;
        imported = PackageSymbol::findForImport(pPVar6,lookupName);
        if (imported != (Symbol *)0x0) {
          pSVar24 = (Symbol *)&imported;
          pVar27 = ska::detailv3::
                   sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>>
                   ::emplace<slang::ast::Symbol_const*&>
                             ((sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>>
                               *)&importDedup.
                                  super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                              ,(Symbol **)pSVar24);
          sVar23 = imports.super_SmallVectorBase<Import>.len;
          pSVar9 = imported;
          if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            __src = (Symbol *)
                    (imports.super_SmallVectorBase<Import>.data_ +
                    imports.super_SmallVectorBase<Import>.len);
            if (imports.super_SmallVectorBase<Import>.len ==
                imports.super_SmallVectorBase<Import>.cap) {
              if (-imports.super_SmallVectorBase<Import>.len == -0x7fffffffffffffff) {
                detail::throwLengthError();
              }
              capacity = imports.super_SmallVectorBase<Import>.len + 1;
              if (imports.super_SmallVectorBase<Import>.len + 1 <
                  imports.super_SmallVectorBase<Import>.len * 2) {
                capacity = imports.super_SmallVectorBase<Import>.len * 2;
              }
              if (-imports.super_SmallVectorBase<Import>.len + 0x7fffffffffffffff <
                  imports.super_SmallVectorBase<Import>.len) {
                capacity = 0x7fffffffffffffff;
              }
              pIVar7 = (pointer)detail::allocArray(capacity,0x10);
              pIVar7[sVar23].imported = pSVar9;
              pIVar7[sVar23].import = this;
              __n = imports.super_SmallVectorBase<Import>.len * 0x10;
              if ((Symbol *)
                  (imports.super_SmallVectorBase<Import>.data_ +
                  imports.super_SmallVectorBase<Import>.len) == __src) {
                __src = (Symbol *)imports.super_SmallVectorBase<Import>.data_;
                pSVar24 = (Symbol *)imports.super_SmallVectorBase<Import>.data_;
                __dest = pIVar7;
                if (imports.super_SmallVectorBase<Import>.len != 0) goto LAB_002209a2;
              }
              else {
                if ((Symbol *)imports.super_SmallVectorBase<Import>.data_ != __src) {
                  memmove(pIVar7,imports.super_SmallVectorBase<Import>.data_,
                          (long)__src - (long)imports.super_SmallVectorBase<Import>.data_);
                }
                __n = (long)imports.super_SmallVectorBase<Import>.data_ +
                      (imports.super_SmallVectorBase<Import>.len * 0x10 - (long)__src);
                pSVar24 = (Symbol *)imports.super_SmallVectorBase<Import>.data_;
                if (__n != 0) {
                  __dest = pIVar7 + sVar23 + 1;
LAB_002209a2:
                  memmove(__dest,__src,__n);
                  pSVar24 = __src;
                }
              }
              SmallVectorBase<Import>::cleanup
                        (&imports.super_SmallVectorBase<Import>,(EVP_PKEY_CTX *)pSVar24);
              imports.super_SmallVectorBase<Import>.len =
                   imports.super_SmallVectorBase<Import>.len + 1;
              imports.super_SmallVectorBase<Import>.data_ = pIVar7;
              imports.super_SmallVectorBase<Import>.cap = capacity;
            }
            else {
              *(Symbol **)__src = imported;
              (__src->name)._M_len = (size_t)this;
              imports.super_SmallVectorBase<Import>.len =
                   imports.super_SmallVectorBase<Import>.len + 1;
              if (imports.super_SmallVectorBase<Import>.len == 0) {
                assert::assertFailed
                          ("len",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                           ,0x62,"reference slang::SmallVectorBase<Import>::back() [T = Import]");
              }
            }
          }
        }
      }
    }
    if (imports.super_SmallVectorBase<Import>.len == 0) {
      ska::detailv3::
      sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
      ::~sherwood_v3_table
                (&importDedup.
                  super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                  .
                  super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                );
      SmallVectorBase<Import>::cleanup
                (&imports.super_SmallVectorBase<Import>,(EVP_PKEY_CTX *)pSVar24);
      goto LAB_00220b05;
    }
    if (imports.super_SmallVectorBase<Import>.len != 1) {
      if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
        sourceRange_01.endLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
        sourceRange_01.startLoc =
             sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
        pDVar11 = LookupResult::addDiag(result,scope,(DiagCode)0xa,sourceRange_01);
        arg_00._M_str = name_local._M_str;
        arg_00._M_len = name_local._M_len;
        pSVar24 = (Symbol *)name_local._M_len;
        Diagnostic::operator<<(pDVar11,arg_00);
        pIVar7 = imports.super_SmallVectorBase<Import>.data_;
        for (lVar25 = imports.super_SmallVectorBase<Import>.len << 4; lVar25 != 0;
            lVar25 = lVar25 + -0x10) {
          Diagnostic::addNote(pDVar11,(DiagCode)0x39000a,(pIVar7->import->super_Symbol).location);
          pSVar24 = (Symbol *)0x40001;
          Diagnostic::addNote(pDVar11,(DiagCode)0x40001,pIVar7->imported->location);
          pIVar7 = pIVar7 + 1;
        }
      }
      goto LAB_00220bef;
    }
    if ((pSVar12 != (SubroutineSymbol *)0x0) &&
       (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged == true)) {
      if ((pSVar12->super_Symbol).kind == ExplicitImport) {
        pEVar8 = Symbol::as<slang::ast::ExplicitImportSymbol>(&pSVar12->super_Symbol);
        pSVar9 = ExplicitImportSymbol::importedSymbol(pEVar8);
        pIVar10 = SmallVectorBase<Import>::operator[]
                            (&imports.super_SmallVectorBase<Import>,(size_type)pSVar24);
        if (pSVar9 == pIVar10->imported) goto LAB_00220ac2;
      }
      sourceRange_00.endLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      sourceRange_00.startLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      pDVar11 = LookupResult::addDiag(result,scope,(DiagCode)0xb000a,sourceRange_00);
      arg._M_str = name_local._M_str;
      arg._M_len = name_local._M_len;
      Diagnostic::operator<<(pDVar11,arg);
      sVar23 = 0x40001;
      Diagnostic::addNote(pDVar11,(DiagCode)0x40001,(pSVar12->super_Symbol).location);
      pIVar10 = SmallVectorBase<Import>::operator[](&imports.super_SmallVectorBase<Import>,sVar23);
      sVar23 = 0x39000a;
      Diagnostic::addNote(pDVar11,(DiagCode)0x39000a,(pIVar10->import->super_Symbol).location);
      pIVar10 = SmallVectorBase<Import>::operator[](&imports.super_SmallVectorBase<Import>,sVar23);
      pSVar24 = (Symbol *)0x40001;
      Diagnostic::addNote(pDVar11,(DiagCode)0x40001,pIVar10->imported->location);
    }
LAB_00220ac2:
    result->wasImported = true;
    pIVar10 = SmallVectorBase<Import>::operator[]
                        (&imports.super_SmallVectorBase<Import>,(size_type)pSVar24);
    result->found = pIVar10->imported;
    do {
      pSVar9 = scope->thisSym;
      if (pSVar9->kind == Package) {
        pPVar6 = Symbol::as<slang::ast::PackageSymbol>(pSVar9);
        pSVar24 = result->found;
        PackageSymbol::noteImport(pPVar6,pSVar24);
        break;
      }
      scope = pSVar9->parentScope;
    } while (scope != (Scope *)0x0);
LAB_00220bef:
    ska::detailv3::
    sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
    ::~sherwood_v3_table
              (&importDedup.
                super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
                .
                super_sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
              );
    SmallVectorBase<Import>::cleanup(&imports.super_SmallVectorBase<Import>,(EVP_PKEY_CTX *)pSVar24)
    ;
    return;
  }
  pSVar12 = (SubroutineSymbol *)((iVar4.current)->field_1).value.second;
  if ((flags.m_bits & 2) == 0) {
    imports.super_SmallVectorBase<Import>.data_ = (pointer)(pSVar12->super_Symbol).parentScope;
    imports.super_SmallVectorBase<Import>.len =
         CONCAT44(imports.super_SmallVectorBase<Import>.len._4_4_,
                  (pSVar12->super_Symbol).indexInScope);
    pSVar24 = (Symbol *)local_120;
    bVar3 = LookupLocation::operator<((LookupLocation *)&imports,(LookupLocation *)pSVar24);
    if ((!bVar3) && (SVar1 = (pSVar12->super_Symbol).kind, 1 < SVar1 - Sequence)) {
      if (SVar1 == ClassType) {
        pCVar14 = Symbol::as<slang::ast::ClassType>((Symbol *)pSVar12);
        ppFVar18 = &pCVar14->firstForward;
LAB_00220cd4:
        pFVar2 = *ppFVar18;
        if (pFVar2 == (ForwardingTypedefSymbol *)0x0) goto LAB_002207c2;
        imports.super_SmallVectorBase<Import>.data_ = (pointer)(pFVar2->super_Symbol).parentScope;
        imports.super_SmallVectorBase<Import>.len =
             CONCAT44(imports.super_SmallVectorBase<Import>.len._4_4_,
                      (pFVar2->super_Symbol).indexInScope);
        pSVar24 = (Symbol *)local_120;
        bVar3 = LookupLocation::operator<((LookupLocation *)&imports,(LookupLocation *)pSVar24);
        result->fromForwardTypedef = true;
      }
      else {
        if (SVar1 == MethodPrototype) {
          pSVar17 = (SubroutineSymbol *)
                    Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)pSVar12);
        }
        else {
          if (SVar1 != Subroutine) {
            if (SVar1 == GenericClassDef) {
              pGVar16 = Symbol::as<slang::ast::GenericClassDefSymbol>((Symbol *)pSVar12);
              ppFVar18 = &pGVar16->firstForward;
            }
            else {
              if (SVar1 != TypeAlias) goto LAB_002207c2;
              pTVar5 = Symbol::as<slang::ast::TypeAliasType>((Symbol *)pSVar12);
              ppFVar18 = &pTVar5->firstForward;
            }
            goto LAB_00220cd4;
          }
          pSVar17 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)pSVar12);
        }
        if (((pSVar17->declaredReturnType).field_0x3f & 0x40) != 0) goto LAB_00220da8;
        pTVar15 = DeclaredType::getType(&pSVar17->declaredReturnType);
        bVar3 = Type::isVoid(pTVar15);
      }
      if (bVar3 == false) goto LAB_002207c2;
    }
  }
  while (SVar1 = (pSVar12->super_Symbol).kind, SVar1 == TransparentMember) {
    pTVar19 = Symbol::as<slang::ast::TransparentMemberSymbol>(&pSVar12->super_Symbol);
    pSVar12 = (SubroutineSymbol *)pTVar19->wrapped;
  }
  if (SVar1 == ForwardingTypedef) {
    pSVar12 = (SubroutineSymbol *)result->found;
LAB_00220d7e:
    if (pSVar12 == (SubroutineSymbol *)0x0) {
      return;
    }
  }
  else {
    if (SVar1 == ModportClocking) {
      pMVar20 = Symbol::as<slang::ast::ModportClockingSymbol>(&pSVar12->super_Symbol);
      pSVar12 = (SubroutineSymbol *)pMVar20->target;
      result->found = (Symbol *)pSVar12;
      goto LAB_00220d7e;
    }
    if (SVar1 == ExplicitImport) {
      pEVar8 = Symbol::as<slang::ast::ExplicitImportSymbol>(&pSVar12->super_Symbol);
      pSVar12 = (SubroutineSymbol *)ExplicitImportSymbol::importedSymbol(pEVar8);
      result->found = (Symbol *)pSVar12;
      result->wasImported = true;
      goto LAB_00220d7e;
    }
    if (SVar1 == MethodPrototype) {
      this_01 = Symbol::as<slang::ast::MethodPrototypeSymbol>(&pSVar12->super_Symbol);
      pSVar12 = MethodPrototypeSymbol::getSubroutine(this_01);
      result->found = &pSVar12->super_Symbol;
      goto LAB_00220d7e;
    }
    result->found = &pSVar12->super_Symbol;
  }
  pDVar21 = Symbol::getDeclaredType(&pSVar12->super_Symbol);
  if (pDVar21 == (DeclaredType *)0x0) {
    return;
  }
  if ((pDVar21->field_0x3f & 0x40) == 0) {
    return;
  }
  pSVar12 = (SubroutineSymbol *)result->found;
LAB_00220da8:
  unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()
            (&reportRecursiveError,&pSVar12->super_Symbol);
  return;
}

Assistant:

void Lookup::unqualifiedImpl(const Scope& scope, string_view name, LookupLocation location,
                             std::optional<SourceRange> sourceRange, bitmask<LookupFlags> flags,
                             SymbolIndex outOfBlockIndex, LookupResult& result) {
    auto reportRecursiveError = [&](const Symbol& symbol) {
        if (sourceRange) {
            auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *sourceRange);
            diag << name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
        }
        result.found = nullptr;
    };

    // Try a simple name lookup to see if we find anything.
    auto& nameMap = scope.getNameMap();
    const Symbol* symbol = nullptr;
    if (auto it = nameMap.find(name); it != nameMap.end()) {
        // If the lookup is for a local name, check that we can access the symbol (it must be
        // declared before use). Callables and block names can be referenced anywhere in the
        // scope, so the location doesn't matter for them.
        symbol = it->second;
        bool locationGood = true;
        if (!flags.has(LookupFlags::AllowDeclaredAfter)) {
            locationGood = LookupLocation::before(*symbol) < location;
            if (!locationGood) {
                // A type alias can have forward definitions, so check those locations as well.
                // The forward decls form a linked list that are always ordered by location,
                // so we only need to check the first one.
                const ForwardingTypedefSymbol* forward = nullptr;
                switch (symbol->kind) {
                    case SymbolKind::TypeAlias:
                        forward = symbol->as<TypeAliasType>().getFirstForwardDecl();
                        break;
                    case SymbolKind::ClassType:
                        forward = symbol->as<ClassType>().getFirstForwardDecl();
                        break;
                    case SymbolKind::GenericClassDef:
                        forward = symbol->as<GenericClassDefSymbol>().getFirstForwardDecl();
                        break;
                    case SymbolKind::Subroutine: {
                        // Subroutines can be referenced before they are declared if they
                        // are tasks or return void (tasks are always set to have a void
                        // return type internally so we only need one check here).
                        //
                        // It's important to check that we're not in the middle of evaluating
                        // the return type before we try to access that return type or
                        // we'll hard fail.
                        auto& sub = symbol->as<SubroutineSymbol>();
                        if (sub.declaredReturnType.isEvaluating()) {
                            reportRecursiveError(*symbol);
                            return;
                        }

                        locationGood = sub.getReturnType().isVoid();
                        break;
                    }
                    case SymbolKind::MethodPrototype: {
                        // Same as above.
                        auto& sub = symbol->as<MethodPrototypeSymbol>();
                        if (sub.declaredReturnType.isEvaluating()) {
                            reportRecursiveError(*symbol);
                            return;
                        }

                        locationGood = sub.getReturnType().isVoid();
                        break;
                    }
                    case SymbolKind::Sequence:
                    case SymbolKind::Property:
                        // Sequences and properties can always be referenced before declaration.
                        locationGood = true;
                        break;
                    default:
                        break;
                }

                if (forward) {
                    locationGood = LookupLocation::before(*forward) < location;
                    result.fromForwardTypedef = true;
                }
            }
        }

        if (locationGood) {
            // Unwrap the symbol if it's hidden behind an import or hoisted enum member.
            while (symbol->kind == SymbolKind::TransparentMember)
                symbol = &symbol->as<TransparentMemberSymbol>().wrapped;

            switch (symbol->kind) {
                case SymbolKind::ExplicitImport:
                    result.found = symbol->as<ExplicitImportSymbol>().importedSymbol();
                    result.wasImported = true;
                    break;
                case SymbolKind::ForwardingTypedef:
                    // If we find a forwarding typedef, the actual typedef was never defined.
                    // Just ignore it, we'll issue a better error later.
                    break;
                case SymbolKind::MethodPrototype:
                    // Looking up a prototype should always forward on to the actual method.
                    result.found = symbol->as<MethodPrototypeSymbol>().getSubroutine();
                    break;
                case SymbolKind::ModportClocking:
                    result.found = symbol->as<ModportClockingSymbol>().target;
                    break;
                default:
                    result.found = symbol;
                    break;
            }

            // We have a fully resolved and valid symbol. Before we return back to the caller,
            // make sure that the symbol we're returning isn't in the process of having its type
            // evaluated. This can only happen with a mutually recursive definition of something
            // like a parameter and a function, so detect and report the error here to avoid a
            // stack overflow.
            if (result.found) {
                auto declaredType = result.found->getDeclaredType();
                if (declaredType && declaredType->isEvaluating())
                    reportRecursiveError(*result.found);
            }

            return;
        }
    }

    // Look through any wildcard imports prior to the lookup point and see if their packages
    // contain the name we're looking for.
    auto wildcardImports = scope.getWildcardImports();
    if (!wildcardImports.empty()) {
        struct Import {
            const Symbol* imported;
            const WildcardImportSymbol* import;
        };
        SmallVector<Import, 4> imports;
        SmallSet<const Symbol*, 2> importDedup;

        for (auto import : wildcardImports) {
            if (location < LookupLocation::after(*import))
                break;

            auto package = import->getPackage();
            if (!package) {
                result.suppressUndeclared = true;
                continue;
            }

            const Symbol* imported = package->findForImport(name);
            if (imported && importDedup.emplace(imported).second)
                imports.emplace_back(Import{imported, import});
        }

        if (!imports.empty()) {
            if (imports.size() > 1) {
                if (sourceRange) {
                    auto& diag = result.addDiag(scope, diag::AmbiguousWildcardImport, *sourceRange);
                    diag << name;
                    for (const auto& pair : imports) {
                        diag.addNote(diag::NoteImportedFrom, pair.import->location);
                        diag.addNote(diag::NoteDeclarationHere, pair.imported->location);
                    }
                }
                return;
            }

            if (symbol && sourceRange) {
                // The existing symbol might be an import for the thing we just imported
                // via wildcard, which is fine so don't error for that case.
                if (symbol->kind != SymbolKind::ExplicitImport ||
                    symbol->as<ExplicitImportSymbol>().importedSymbol() != imports[0].imported) {

                    auto& diag = result.addDiag(scope, diag::ImportNameCollision, *sourceRange);
                    diag << name;
                    diag.addNote(diag::NoteDeclarationHere, symbol->location);
                    diag.addNote(diag::NoteImportedFrom, imports[0].import->location);
                    diag.addNote(diag::NoteDeclarationHere, imports[0].imported->location);
                }
            }

            result.wasImported = true;
            result.found = imports[0].imported;

            // If we are doing this lookup from a scope that is within a package declaration
            // we should note that fact so that it can later be exported if desired.
            auto currScope = &scope;
            do {
                auto& sym = currScope->asSymbol();
                if (sym.kind == SymbolKind::Package) {
                    sym.as<PackageSymbol>().noteImport(*result.found);
                    break;
                }

                currScope = sym.getParentScope();
            } while (currScope);

            return;
        }
    }

    // Continue up the scope chain via our parent.
    location = LookupLocation::after(scope.asSymbol());
    if (!location.getScope())
        return;

    // If this scope was an out-of-block subroutine, tell the next recursive call about it.
    // Otherwise, if our previous call was for such a situation and we didn't find the symbol
    // in this class scope, we need to use the subroutine's out-of-block lookup location
    // instead in order to properly handle cases like:
    //   class C;
    //     extern function int foo;
    //   endclass
    //   localparam int k = ...;
    //   function int C::foo;
    //     return k;
    //   endfunction
    auto& sym = scope.asSymbol();
    if (sym.kind == SymbolKind::Subroutine) {
        outOfBlockIndex = sym.as<SubroutineSymbol>().outOfBlockIndex;
    }
    else if (sym.kind == SymbolKind::ConstraintBlock) {
        outOfBlockIndex = sym.as<ConstraintBlockSymbol>().getOutOfBlockIndex();
    }
    else if (uint32_t(outOfBlockIndex) != 0) {
        location = LookupLocation(location.getScope(), uint32_t(outOfBlockIndex));
        outOfBlockIndex = SymbolIndex(0);
    }
    else if (sym.kind == SymbolKind::ClassType) {
        // Suppress errors when we fail to find a symbol inside a class that
        // had a problem resolving its base class, since the symbol may be
        // expected to be defined in the base.
        auto baseClass = sym.as<ClassType>().getBaseClass();
        result.suppressUndeclared |= baseClass && baseClass->isError();
    }

    return unqualifiedImpl(*location.getScope(), name, location, sourceRange, flags,
                           outOfBlockIndex, result);
}